

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<7>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  undefined4 uVar1;
  undefined8 in_RAX;
  uint8 *puVar2;
  RepeatedField<unsigned_int> *array;
  long lVar3;
  uint32 local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      lVar3 = 0;
      do {
        uVar1 = *(undefined4 *)(*(long *)((long)field + 8) + lVar3 * 4);
        if ((output->impl_).end_ <= output->cur_) {
          puVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
          output->cur_ = puVar2;
        }
        puVar2 = output->cur_;
        *(undefined4 *)puVar2 = uVar1;
        output->cur_ = puVar2 + 4;
        lVar3 = lVar3 + 1;
      } while (lVar3 < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}